

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

void __thiscall
dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::any_function
          (any_function<void_(dlib::toggle_button_&),_void,_1UL> *this,
          any_function<void_(dlib::toggle_button_&),_void,_1UL> *item)

{
  bool bVar1;
  pointer pTVar2;
  undefined8 in_RDI;
  unique_ptr<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>,_std::default_delete<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  unique_ptr<dlib::any_function<void(dlib::toggle_button&),void,1ul>::Tbase<void(dlib::toggle_button&)>,std::default_delete<dlib::any_function<void(dlib::toggle_button&),void,1ul>::Tbase<void(dlib::toggle_button&)>>>
  ::
  unique_ptr<std::default_delete<dlib::any_function<void(dlib::toggle_button&),void,1ul>::Tbase<void(dlib::toggle_button&)>>,void>
            (in_stack_ffffffffffffffe0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>,_std::default_delete<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>_>_>
                      *)0x4863c6);
  if (bVar1) {
    pTVar2 = std::
             unique_ptr<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>,_std::default_delete<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>_>_>
             ::operator->((unique_ptr<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>,_std::default_delete<dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::Tbase<void_(dlib::toggle_button_&)>_>_>
                           *)0x4863d6);
    (*pTVar2->_vptr_Tbase[3])(pTVar2,in_RDI);
  }
  return;
}

Assistant:

any_function (
    const any_function& item
)
{
    if (item.data)
    {
        item.data->copy_to(data);
    }
}